

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O0

void __thiscall iutest::detail::iuRegex::iuRegex(iuRegex *this,iuRegex *rhs)

{
  iuRegex *rhs_local;
  iuRegex *this_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&this->m_re,&rhs->m_re);
  std::__cxx11::string::string((string *)&this->m_pattern,(string *)&rhs->m_pattern);
  return;
}

Assistant:

iuRegex(const iuRegex & rhs) : m_re(rhs.m_re), m_pattern(rhs.m_pattern) {}